

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O3

BOOL SetEnvironmentVariableA(LPCSTR lpName,LPCSTR lpValue)

{
  BOOL BVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  BOOL BVar5;
  DWORD dwErrCode;
  size_t szSize;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_001330b9;
  BVar5 = 0;
  if ((lpName != (LPCSTR)0x0) && (BVar5 = 0, *lpName != '\0')) {
    if (lpValue == (LPCSTR)0x0) {
      pcVar4 = MiscGetenv(lpName);
      if (pcVar4 == (char *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001330b9;
        dwErrCode = 0xcb;
        goto LAB_0013309c;
      }
      MiscUnsetenv(lpName);
      BVar5 = 1;
    }
    else {
      sVar2 = strlen(lpName);
      sVar3 = strlen(lpValue);
      szSize = (size_t)((int)sVar3 + (int)sVar2 + 2);
      pcVar4 = (char *)PAL_malloc(szSize);
      if (pcVar4 == (char *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001330b9;
        dwErrCode = 8;
LAB_0013309c:
        SetLastError(dwErrCode);
      }
      else {
        sprintf_s(pcVar4,szSize,"%s=%s",lpName,lpValue);
        BVar1 = MiscPutenv(pcVar4,0);
        PAL_free(pcVar4);
        BVar5 = 1;
        if (BVar1 == 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_001330b9;
          SetLastError(8);
          BVar5 = 0;
        }
      }
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar5;
  }
LAB_001330b9:
  abort();
}

Assistant:

BOOL
PALAPI
SetEnvironmentVariableA(
			IN LPCSTR lpName,
			IN LPCSTR lpValue)
{

    BOOL bRet = FALSE;
    int nResult =0;
    PERF_ENTRY(SetEnvironmentVariableA);
    ENTRY("SetEnvironmentVariableA(lpName=%p (%s), lpValue=%p (%s))\n",
        lpName?lpName:"NULL",
        lpName?lpName:"NULL", lpValue?lpValue:"NULL", lpValue?lpValue:"NULL");

    /*check if the input variable name is null
     * and if so exit*/
    if ((lpName == NULL) || (lpName[0] == 0))
    {
        ERROR("lpName is NULL\n");
        goto done;
    }
    /*check if the input value is null and if so
     * check if the input name is valid and delete
     * the variable name from process environment*/
    if (lpValue == NULL)
    {
        if ((lpValue = MiscGetenv(lpName)) == NULL)
        {
            ERROR("Couldn't find environment variable (%s)\n", lpName);
            SetLastError(ERROR_ENVVAR_NOT_FOUND);
            goto done;
        }
        MiscUnsetenv(lpName);
    }
    /*All the conditions are met. Set the variable*/
    else
    {
        int iLen = strlen(lpName) + strlen(lpValue) + 2;
        LPSTR string = (LPSTR) PAL_malloc(iLen);
        if (string == NULL)
        {
            bRet = FALSE;
            ERROR("Unable to allocate memory\n");
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
        
        sprintf_s(string, iLen, "%s=%s", lpName, lpValue);
        nResult = MiscPutenv(string, FALSE) ? 0 : -1;

        PAL_free(string);
        string = NULL;
        
        // If MiscPutenv returns FALSE, it almost certainly failed to
        // allocate memory.        
        if(nResult == -1)
        {
            bRet = FALSE;
            ERROR("Unable to allocate memory\n");
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
    }
    bRet = TRUE;
done:
    LOGEXIT("SetEnvironmentVariableA returning BOOL %d\n", bRet);    
    PERF_EXIT(SetEnvironmentVariableA);
    return bRet;
}